

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::rebuildOrderHeap(Solver *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool local_51;
  lbool local_35 [17];
  int local_24;
  undefined1 local_20 [4];
  Var v;
  vec<int,_int> vs;
  Solver *this_local;
  
  vs._8_8_ = this;
  vec<int,_int>::vec((vec<int,_int> *)local_20);
  for (local_24 = 0; iVar1 = local_24, iVar2 = nVars(this), iVar1 < iVar2; local_24 = local_24 + 1)
  {
    pcVar3 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                        local_24);
    local_51 = false;
    if (*pcVar3 != '\0') {
      local_35[0] = value(this,local_24);
      local_51 = lbool::operator==(local_35,l_Undef);
    }
    if (local_51 != false) {
      vec<int,_int>::push((vec<int,_int> *)local_20,&local_24);
    }
  }
  Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::build
            (&this->order_heap,(vec<int,_int> *)local_20);
  vec<int,_int>::~vec((vec<int,_int> *)local_20);
  return;
}

Assistant:

void Solver::rebuildOrderHeap()
{
    vec<Var> vs;
    for (Var v = 0; v < nVars(); v++)
        if (decision[v] && value(v) == l_Undef)
            vs.push(v);
    order_heap.build(vs);
}